

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

_Bool CrawlIdentifierCharacters(Lexer *lexer)

{
  bool bVar1;
  char cVar2;
  _Bool _Var3;
  ushort **ppuVar4;
  _Bool inside;
  char *checkCharacters;
  char nextChar;
  char currentChar;
  Lexer *lexer_local;
  
  cVar2 = GetCurrentCharacter(lexer);
  checkCharacters._6_1_ = PeekNextCharacter(lexer);
  ppuVar4 = __ctype_b_loc();
  if ((((*ppuVar4)[(int)cVar2] & 0x400) == 0) && (cVar2 != '_')) {
    return false;
  }
  SetTokenStart(lexer);
  bVar1 = false;
  while ((ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)checkCharacters._6_1_] & 8) != 0 ||
         (_Var3 = IsCharacter(checkCharacters._6_1_,"$_"), _Var3))) {
    checkCharacters._6_1_ = PeekNextCharacter(lexer);
    GetNextCharacter(lexer);
    bVar1 = true;
  }
  if (!bVar1) {
    GetNextCharacter(lexer);
  }
  SetTokenEnd(lexer);
  return true;
}

Assistant:

bool CrawlIdentifierCharacters(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	char nextChar = PeekNextCharacter(lexer);
	if (isalpha(currentChar) || currentChar == '_'){
		SetTokenStart(lexer);
		char* checkCharacters = "$_";
		bool inside = false;
		while (true){
			if (!isalnum(nextChar) && !IsCharacter(nextChar, checkCharacters)) break;
			nextChar = PeekNextCharacter(lexer);
			GetNextCharacter(lexer);
			inside = true;
		}
		if (!inside) GetNextCharacter(lexer);
		SetTokenEnd(lexer);
		return true;
	}
	return false;
}